

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

Clause * Kernel::Clause::fromClause(Clause *c)

{
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  litit;
  Clause *pCVar1;
  SplitSet *pSVar2;
  Clause *in_RDI;
  Clause *res;
  SimplifyingInference1 *in_stack_ffffffffffffff48;
  Inference *in_stack_ffffffffffffff50;
  Clause *in_stack_ffffffffffffff60;
  SimplifyingInference1 local_68 [3];
  Inference *in_stack_ffffffffffffffd0;
  SplitSet *local_28;
  Clause *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  
  iterLits(in_stack_ffffffffffffff60);
  SimplifyingInference1::SimplifyingInference1(local_68,REORDER_LITERALS,in_RDI);
  Inference::Inference(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  litit._iter._inner._next = (int)in_stack_ffffffffffffffe8;
  litit._iter._inner._from = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  litit._iter._func.a = in_stack_ffffffffffffffe0;
  litit._iter._16_8_ = in_stack_fffffffffffffff0;
  pCVar1 = fromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>>
                     (litit,in_stack_ffffffffffffffd0);
  Inference::~Inference((Inference *)(local_68 + 1));
  pSVar2 = splits((Clause *)0x8420e3);
  if (pSVar2 != (SplitSet *)0x0) {
    splits((Clause *)0x842103);
    setSplits(in_stack_ffffffffffffffe0,local_28);
  }
  return pCVar1;
}

Assistant:

Clause* Clause::fromClause(Clause* c)
{
  Clause* res = fromIterator(c->iterLits(), SimplifyingInference1(InferenceRule::REORDER_LITERALS, c));

  if (c->splits()) {
    res->setSplits(c->splits());
  }

  return res;
}